

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O3

void __thiscall Triangle_Watertight_Test::TestBody(Triangle_Watertight_Test *this)

{
  Point3<float> *__args;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  AssertHelper AVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  undefined8 uVar13;
  Allocator alloc;
  byte bVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  int iVar19;
  ShapeHandle *tri;
  long lVar20;
  ShapeHandle *pSVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar34 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar35 [64];
  undefined1 auVar30 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined4 in_XMM5_Da;
  undefined1 in_register_00001344 [12];
  undefined4 uVar40;
  float in_stack_fffffffffffffc28;
  float in_stack_fffffffffffffc2c;
  int nPhi;
  int nTheta;
  vector<int,_std::allocator<int>_> indices;
  int nHits;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> vertices;
  AssertHelper local_390;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  AssertionResult gtest_ar_4;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  int nVertices;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> tris;
  Ray local_2f8;
  AssertionResult gtest_ar;
  undefined8 local_2c0 [30];
  bool local_1d0;
  undefined1 local_1c8 [16];
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_1b8;
  vector<int,_std::allocator<int>_> local_1a0;
  TriangleMesh mesh;
  void *local_148;
  undefined8 uStack_140;
  long local_138;
  void *local_128;
  undefined8 uStack_120;
  long local_118;
  void *local_108;
  undefined8 uStack_100;
  long local_f8;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_e8;
  Transform identity;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  nTheta = 0x10;
  nPhi = 0x10;
  identity.m.m[0][0] = 4.2039e-45;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&gtest_ar,"nTheta","3",&nTheta,(int *)&identity);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&identity);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mesh,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
               ,0x22,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mesh,(Message *)&identity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mesh);
    if (identity.m.m[0]._0_8_ != 0) {
      bVar10 = testing::internal::IsTrue(true);
      if ((bVar10) && (identity.m.m[0]._0_8_ != 0)) {
        (**(code **)(*(long *)identity.m.m[0]._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    identity.m.m[0][0] = 5.60519e-45;
    testing::internal::CmpHelperGE<int,int>((internal *)&gtest_ar,"nPhi","4",&nPhi,(int *)&identity)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&identity);
      if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
          (undefined8 *)0x0) {
        pcVar18 = "";
      }
      else {
        pcVar18 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mesh,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                 ,0x23,pcVar18);
      testing::internal::AssertHelper::operator=((AssertHelper *)&mesh,(Message *)&identity);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mesh);
      if (identity.m.m[0]._0_8_ != 0) {
        bVar10 = testing::internal::IsTrue(true);
        if ((bVar10) && (identity.m.m[0]._0_8_ != 0)) {
          (**(code **)(*(long *)identity.m.m[0]._0_8_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      vertices.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar25 = 0;
      vertices.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vertices.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nVertices = nPhi * nTheta;
      if (0 < nTheta) {
        uVar22 = 0x5f6f467652a01b04;
        do {
          iVar11 = (int)uVar25;
          fVar29 = ((float)iVar11 * 3.1415927) / (float)(nTheta + -1);
          local_388._0_4_ = fVar29;
          fVar29 = cosf(fVar29);
          local_378._0_4_ = fVar29;
          auVar34._0_4_ = sinf((float)local_388._0_4_);
          auVar34._4_60_ = extraout_var;
          if (0 < nPhi) {
            lVar20 = 0;
            iVar23 = 0;
            auVar27 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar34._0_16_);
            uVar13 = vcmpss_avx512f(auVar34._0_16_,SUB6416(ZEXT464(0xbf800000),0),1);
            bVar10 = (bool)((byte)uVar13 & 1);
            iVar26 = (uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar27._0_4_;
            auVar27 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_378._0_4_));
            uVar13 = vcmpss_avx512f(ZEXT416((uint)local_378._0_4_),SUB6416(ZEXT464(0xbf800000),0),1)
            ;
            bVar10 = (bool)((byte)uVar13 & 1);
            local_338._4_4_ = iVar26;
            local_338._0_4_ = iVar26;
            fStack_330 = (float)iVar26;
            fStack_32c = (float)iVar26;
            local_328._4_12_ = auVar27._4_12_;
            local_328._0_4_ = (uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar27._0_4_;
            do {
              if (iVar11 == 0) {
                gtest_ar.success_ = false;
                gtest_ar._1_7_ = 0;
                gtest_ar.message_.ptr_._0_4_ = 1.0;
                if (vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
                  _M_realloc_insert<pbrt::Point3<float>>
                            ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)
                             &vertices,
                             (iterator)
                             vertices.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(Point3<float> *)&gtest_ar);
                }
                else {
LAB_002dbb89:
                  gtest_ar.success_ = false;
                  gtest_ar._1_7_ = 0;
                  ((vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>).z
                       = gtest_ar.message_.ptr_._0_4_;
                  uVar13 = 0;
LAB_002dbb9b:
                  ((vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>).x
                       = (float)(int)uVar13;
                  ((vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>).y
                       = (float)(int)((ulong)uVar13 >> 0x20);
                  vertices.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       vertices.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              else if (iVar11 == nTheta + -1) {
                gtest_ar.success_ = false;
                gtest_ar._1_7_ = 0;
                gtest_ar.message_.ptr_._0_4_ = -1.0;
                if (vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_002dbb89;
                std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
                _M_realloc_insert<pbrt::Point3<float>>
                          ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)
                           &vertices,
                           (iterator)
                           vertices.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(Point3<float> *)&gtest_ar);
              }
              else if (iVar23 == nPhi + -1) {
                __args = vertices.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         ((ulong)((long)vertices.
                                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)vertices.
                                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                         -0x5555555555555555 + lVar20;
                if (vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ((vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>).z
                       = (__args->super_Tuple3<pbrt::Point3,_float>).z;
                  uVar13._0_4_ = (__args->super_Tuple3<pbrt::Point3,_float>).x;
                  uVar13._4_4_ = (__args->super_Tuple3<pbrt::Point3,_float>).y;
                  goto LAB_002dbb9b;
                }
                std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
                _M_realloc_insert<pbrt::Point3<float>const&>
                          ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)
                           &vertices,
                           (iterator)
                           vertices.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__args);
              }
              else {
                uVar17 = (uint)(uVar22 >> 0x2d) ^ (uint)(uVar22 >> 0x1b);
                bVar14 = (byte)(uVar22 >> 0x3b);
                fVar29 = ((float)iVar23 * 6.2831855) / (float)(nPhi + -1);
                auVar27._4_12_ = in_register_00001344;
                auVar27._0_4_ = in_XMM5_Da;
                auVar27 = vcvtusi2ss_avx512f(auVar27,uVar17 >> bVar14 | uVar17 << 0x20 - bVar14);
                local_388 = vminss_avx(ZEXT416((uint)(auVar27._0_4_ * 2.3283064e-10)),
                                       ZEXT416(0x3f7fffff));
                local_378._0_4_ = cosf(fVar29);
                local_378._4_4_ = extraout_XMM0_Db;
                local_378._8_4_ = extraout_XMM0_Dc;
                local_378._12_4_ = extraout_XMM0_Dd;
                auVar35._0_4_ = sinf(fVar29);
                auVar35._4_60_ = extraout_var_00;
                auVar27 = vfmadd213ss_fma(local_388,SUB6416(ZEXT464(0x40a00000),0),
                                          ZEXT416(0x3f800000));
                fVar29 = auVar27._0_4_;
                gtest_ar.message_.ptr_._0_4_ = fVar29 * (float)local_328._0_4_ + 0.0;
                auVar27 = vinsertps_avx(local_378,auVar35._0_16_,0x10);
                auVar28._0_4_ = fVar29 * auVar27._0_4_ * (float)local_338._0_4_ + 0.0;
                auVar28._4_4_ = fVar29 * auVar27._4_4_ * (float)local_338._4_4_ + 0.0;
                auVar28._8_4_ = fVar29 * auVar27._8_4_ * fStack_330 + 0.0;
                auVar28._12_4_ = fVar29 * auVar27._12_4_ * fStack_32c + 0.0;
                gtest_ar._0_8_ = vmovlps_avx(auVar28);
                if (vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
                  _M_realloc_insert<pbrt::Point3<float>>
                            ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)
                             &vertices,
                             (iterator)
                             vertices.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(Point3<float> *)&gtest_ar);
                }
                else {
                  ((vertices.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float>).z
                       = gtest_ar.message_.ptr_._0_4_;
                  *(undefined8 *)
                   &(vertices.
                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Point3,_float> =
                       gtest_ar._0_8_;
                  vertices.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       vertices.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
                uVar22 = uVar22 * 0x5851f42d4c957f2d + 0x5e9f;
              }
              iVar23 = iVar23 + 1;
              lVar20 = lVar20 + -1;
            } while (iVar23 < nPhi);
          }
          uVar25 = (ulong)(iVar11 + 1U);
        } while ((int)(iVar11 + 1U) < nTheta);
        uVar25 = ((long)vertices.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vertices.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      }
      identity.m.m[0]._0_8_ = uVar25;
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&gtest_ar,"nVertices","vertices.size()",&nVertices,
                 (unsigned_long *)&identity);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&identity);
        if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
            (undefined8 *)0x0) {
          pcVar18 = "";
        }
        else {
          pcVar18 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mesh,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                   ,0x40,pcVar18);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mesh,(Message *)&identity);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mesh);
        if (identity.m.m[0]._0_8_ != 0) {
          bVar10 = testing::internal::IsTrue(true);
          if ((bVar10) && (identity.m.m[0]._0_8_ != 0)) {
            (**(code **)(*(long *)identity.m.m[0]._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar11 = nPhi;
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if (1 < nPhi) {
        iVar26 = nPhi + 1;
        iVar23 = 0;
        do {
          gtest_ar._0_8_ = gtest_ar._0_8_ & 0xffffffff00000000;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = 0;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            gtest_ar._0_4_ = iVar11 + iVar23;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = iVar11 + iVar23;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          gtest_ar._0_4_ = iVar26 + iVar23;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = gtest_ar._0_4_;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar23 = iVar23 + 1;
        } while (iVar23 < nPhi + -1);
      }
      iVar23 = nPhi;
      if (3 < nTheta) {
        iVar16 = 1;
        iVar26 = nTheta;
        do {
          auVar27 = local_388;
          if (iVar23 < 2) {
            iVar16 = iVar16 + 1;
          }
          else {
            iVar23 = 0;
            iVar26 = (iVar16 + 1) * iVar11;
            local_378._0_4_ = iVar16 + 1;
            local_388._4_4_ = 0;
            local_388._0_4_ = iVar16 * iVar11 + 1;
            local_388._8_8_ = auVar27._8_8_;
            do {
              iVar24 = iVar16 * iVar11 + iVar23;
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                gtest_ar._0_4_ = iVar24;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar24;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              gtest_ar._0_4_ = iVar26 + iVar23;
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = gtest_ar._0_4_;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              iVar19 = iVar26 + 1 + iVar23;
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                gtest_ar._0_4_ = iVar19;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar19;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                gtest_ar._0_4_ = iVar24;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar24;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                gtest_ar._0_4_ = iVar19;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar19;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              gtest_ar._0_4_ = local_388._0_4_ + iVar23;
              if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&indices,(iterator)
                                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,(int *)&gtest_ar);
              }
              else {
                *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = gtest_ar._0_4_;
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              iVar23 = iVar23 + 1;
            } while (iVar23 < nPhi + -1);
            iVar26 = nTheta;
            iVar16 = local_378._0_4_;
            iVar23 = nPhi;
          }
        } while (iVar16 < iVar26 + -2);
      }
      if (1 < iVar23) {
        iVar23 = 0;
        do {
          iVar26 = (nTheta + -1) * iVar11;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            gtest_ar._0_4_ = iVar26;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = iVar26;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          gtest_ar._0_4_ = (nTheta + -2) * iVar11 + iVar23;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = gtest_ar._0_4_;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          gtest_ar._0_4_ = iVar23 + 1 + (nTheta + -2) * iVar11;
          if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&indices,(iterator)
                                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&gtest_ar);
          }
          else {
            *indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = gtest_ar._0_4_;
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar23 = iVar23 + 1;
        } while (iVar23 < nPhi + -1);
      }
      pbrt::Transform::Transform(&identity);
      std::vector<int,_std::allocator<int>_>::vector(&local_1a0,&indices);
      uVar40 = 0;
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
                (&local_1b8,&vertices);
      local_e8.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108 = (void *)0x0;
      uStack_100 = 0;
      local_f8 = 0;
      local_128 = (void *)0x0;
      uStack_120 = 0;
      local_118 = 0;
      local_148 = (void *)0x0;
      uStack_140 = 0;
      local_138 = 0;
      n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_128;
      n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_108;
      n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&local_148;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = uVar40;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x2dc35b;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffc28;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffc2c;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = nPhi;
      uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = nTheta;
      faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      pbrt::TriangleMesh::TriangleMesh
                (&mesh,&identity,false,&local_1a0,&local_1b8,&local_e8,n,uv,faceIndices);
      if (local_148 != (void *)0x0) {
        operator_delete(local_148,local_138 - (long)local_148);
      }
      if (local_128 != (void *)0x0) {
        operator_delete(local_128,local_118 - (long)local_128);
      }
      if (local_108 != (void *)0x0) {
        operator_delete(local_108,local_f8 - (long)local_108);
      }
      if (local_e8.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1b8.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1b8.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b8.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      pbrt::Triangle::CreateTriangles(&tris,&mesh,alloc);
      lVar20 = 0;
      do {
        uVar25 = ((ulong)(lVar20 * 0x7fb5d329728ea185) >> 0x1b ^ lVar20 * 0x7fb5d329728ea185) *
                 -0x7e25210b43d22bb3;
        uVar25 = ((uVar25 >> 0x21 ^ uVar25) + 1) * 0x5851f42d4c957f2d + lVar20 * -0x4f5c17a566d501a4
                 + 1;
        uVar22 = uVar25 * 0x5851f42d4c957f2d + 1 + lVar20 * 2;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar25;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar22;
        auVar27 = vpunpcklqdq_avx(auVar37,auVar30);
        uVar25 = uVar22 * 0x5851f42d4c957f2d + 1 + lVar20 * 2;
        uVar22 = uVar25 * 0x5851f42d4c957f2d + 1 + lVar20 * 2;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar22;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar25;
        auVar28 = vpunpcklqdq_avx(auVar38,auVar39);
        auVar33._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar28;
        auVar33._16_16_ = ZEXT116(1) * auVar27;
        auVar3 = vpsrlvq_avx2(auVar33,_DAT_00603560);
        auVar4 = vpsrlvq_avx2(auVar33,_DAT_00603540);
        auVar33 = vpsrlq_avx2(auVar33,0x3b);
        auVar27 = vpmovqd_avx512vl(auVar33);
        auVar28 = vpmovqd_avx512vl(auVar4 ^ auVar3);
        auVar27 = vprorvd_avx512vl(auVar28,auVar27);
        auVar27 = vcvtudq2ps_avx512vl(auVar27);
        auVar6._8_4_ = 0x2f800000;
        auVar6._0_8_ = 0x2f8000002f800000;
        auVar6._12_4_ = 0x2f800000;
        _local_338 = vmulps_avx512vl(auVar27,auVar6);
        auVar7._8_4_ = 0x3f7fffff;
        auVar7._0_8_ = 0x3f7fffff3f7fffff;
        auVar7._12_4_ = 0x3f7fffff;
        uVar25 = vcmpps_avx512vl(_local_338,auVar7,1);
        auVar27 = vshufps_avx(_local_338,_local_338,0xff);
        local_378._0_2_ = (short)uVar25;
        local_388._0_2_ = (ushort)(uVar25 >> 1) & 0x7f;
        bVar14 = (byte)uVar25 >> 2;
        bVar5 = (byte)uVar25 >> 3;
        auVar28 = vshufpd_avx(_local_338,_local_338,1);
        auVar6 = vfmadd213ss_fma(ZEXT416((uint)(bVar5 & 1) * auVar27._0_4_ +
                                         (uint)!(bool)(bVar5 & 1) * 0x3f7fffff),
                                 SUB6416(ZEXT464(0xc0000000),0),SUB6416(ZEXT464(0x3f800000),0));
        auVar27 = vfnmadd213ss_fma(auVar6,auVar6,SUB6416(ZEXT464(0x3f800000),0));
        auVar27 = vmaxss_avx(auVar27,ZEXT816(0));
        local_328 = vsqrtss_avx(auVar27,auVar27);
        fVar29 = (float)((uint)(bVar14 & 1) * (int)(auVar28._0_4_ * 6.2831855) +
                        (uint)!(bool)(bVar14 & 1) * 0x40c90fda);
        local_1c8._0_4_ = cosf(fVar29);
        local_1c8._4_4_ = extraout_XMM0_Db_00;
        local_1c8._8_4_ = extraout_XMM0_Dc_00;
        local_1c8._12_4_ = extraout_XMM0_Dd_00;
        auVar36._0_4_ = sinf(fVar29);
        auVar36._4_60_ = extraout_var_01;
        local_358._0_4_ = auVar6._0_4_;
        fVar29 = (float)local_358._0_4_ * 0.5;
        auVar27 = vinsertps_avx(local_1c8,auVar36._0_16_,0x10);
        auVar31._0_4_ = (float)local_328._0_4_ * auVar27._0_4_;
        auVar31._4_4_ = (float)local_328._0_4_ * auVar27._4_4_;
        auVar31._8_4_ = (float)local_328._0_4_ * auVar27._8_4_;
        auVar31._12_4_ = (float)local_328._0_4_ * auVar27._12_4_;
        auVar8._8_4_ = 0x3f000000;
        auVar8._0_8_ = 0x3f0000003f000000;
        auVar8._12_4_ = 0x3f000000;
        auVar27 = vmulps_avx512vl(auVar31,auVar8);
        local_358._4_4_ = auVar27._4_4_ + 0.0;
        local_358._0_4_ = auVar27._0_4_ + 0.0;
        fStack_350 = auVar27._8_4_ + 0.0;
        fStack_34c = auVar27._12_4_ + 0.0;
        local_328._0_4_ = fVar29 + 0.0;
        auVar27 = vmovshdup_avx(_local_338);
        auVar28 = vfmadd132ss_fma(ZEXT416((uint)(local_388[0] & 1) * auVar27._0_4_ +
                                          (uint)!(bool)(local_388[0] & 1) * 0x3f7fffff),
                                  SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
        auVar27 = vfnmadd213ss_fma(auVar28,auVar28,SUB6416(ZEXT464(0x3f800000),0));
        auVar27 = vmaxss_avx(auVar27,ZEXT816(0) << 0x20);
        auVar27 = vsqrtss_avx(auVar27,auVar27);
        local_388._0_4_ = auVar27._0_4_;
        fVar29 = (float)((uint)(local_378[0] & 1) * (int)(local_338._0_4_ * 6.2831855) +
                        (uint)!(bool)(local_378[0] & 1) * 0x40c90fda);
        local_1c8 = ZEXT416((uint)fVar29);
        _local_338 = auVar28;
        fVar29 = cosf(fVar29);
        local_378 = ZEXT416((uint)(fVar29 * (float)local_388._0_4_));
        fVar29 = sinf((float)local_1c8._0_4_);
        nHits = 0;
        local_2f8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(_local_358);
        local_2f8.o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_328._0_4_;
        auVar27 = vinsertps_avx(local_378,ZEXT416((uint)(fVar29 * (float)local_388._0_4_)),0x10);
        local_2f8.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar27);
        local_2f8.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_338._0_4_;
        local_2f8.time = 0.0;
        local_2f8.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )0;
        if (tris.nStored != 0) {
          lVar15 = tris.nStored << 3;
          pSVar21 = tris.ptr;
          do {
            pbrt::ShapeHandle::Intersect
                      ((optional<pbrt::ShapeIntersection> *)&gtest_ar,pSVar21,&local_2f8,INFINITY);
            if (local_1d0 == true) {
              nHits = nHits + 1;
            }
            pSVar21 = pSVar21 + 1;
            lVar15 = lVar15 + -8;
          } while (lVar15 != 0);
        }
        gtest_ar_4.success_ = true;
        gtest_ar_4._1_3_ = 0;
        testing::internal::CmpHelperGE<int,int>
                  ((internal *)&gtest_ar,"nHits","1",&nHits,(int *)&gtest_ar_4);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_4);
          pcVar18 = "";
          if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
              (undefined8 *)0x0) {
            pcVar18 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_390,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                     ,0x74,pcVar18);
          testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar_4);
          testing::internal::AssertHelper::~AssertHelper(&local_390);
          if (CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) != 0) {
            bVar10 = testing::internal::IsTrue(true);
            if ((bVar10) && ((long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_4._4_4_,gtest_ar_4._0_4_) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        iVar11 = (int)((ulong)((long)vertices.
                                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)vertices.
                                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2);
        uVar17 = iVar11 * -0x55555555;
        do {
          uVar22 = uVar22 * 0x5851f42d4c957f2d + lVar20 * 2 + 1;
          uVar12 = (uint)(uVar22 >> 0x2d) ^ (uint)(uVar22 >> 0x1b);
          bVar14 = (byte)(uVar22 >> 0x3b);
          uVar12 = uVar12 >> bVar14 | uVar12 << 0x20 - bVar14;
        } while (uVar12 < (uint)(iVar11 * 0x55555555) % uVar17);
        uVar25 = (ulong)uVar12 % (ulong)uVar17;
        auVar32._8_8_ = 0;
        auVar32._0_4_ = local_2f8.o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar32._4_4_ = local_2f8.o.super_Tuple3<pbrt::Point3,_float>.y;
        local_2f8.d.super_Tuple3<pbrt::Vector3,_float>.z =
             vertices.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].super_Tuple3<pbrt::Point3,_float>.z;
        uVar1 = vertices.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar25].super_Tuple3<pbrt::Point3,_float>.x
        ;
        uVar2 = vertices.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar25].super_Tuple3<pbrt::Point3,_float>.y
        ;
        local_378._4_4_ = uVar2;
        local_378._0_4_ = uVar1;
        local_378._8_8_ = 0;
        nHits = 0;
        local_388._0_4_ = local_2f8.d.super_Tuple3<pbrt::Vector3,_float>.z;
        local_2f8.d.super_Tuple3<pbrt::Vector3,_float>.z =
             local_2f8.d.super_Tuple3<pbrt::Vector3,_float>.z -
             local_2f8.o.super_Tuple3<pbrt::Point3,_float>.z;
        auVar27 = vsubps_avx(local_378,auVar32);
        local_2f8.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar27);
        if (tris.nStored != 0) {
          lVar15 = tris.nStored << 3;
          pSVar21 = tris.ptr;
          do {
            pbrt::ShapeHandle::Intersect
                      ((optional<pbrt::ShapeIntersection> *)&gtest_ar,pSVar21,&local_2f8,INFINITY);
            if (local_1d0 == true) {
              nHits = nHits + 1;
            }
            pSVar21 = pSVar21 + 1;
            lVar15 = lVar15 + -8;
          } while (lVar15 != 0);
        }
        gtest_ar._0_4_ = 1;
        testing::internal::CmpHelperGE<int,int>
                  ((internal *)&gtest_ar_4,"nHits","1",&nHits,(int *)&gtest_ar);
        if (gtest_ar_4.success_ == false) {
          testing::Message::Message((Message *)&local_390);
          AVar9.data_ = local_390.data_;
          vmovshdup_avx(local_378);
          pbrt::internal::ToString3<float>(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28,0.0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(AVar9.data_)->line,(char *)gtest_ar._0_8_,
                     CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_));
          if ((undefined8 *)gtest_ar._0_8_ != local_2c0) {
            operator_delete((void *)gtest_ar._0_8_,local_2c0[0] + 1);
          }
          pcVar18 = "";
          if (gtest_ar_4.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar18 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                     ,0x7e,pcVar18);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar,(Message *)&local_390);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
          if (local_390.data_ != (AssertHelperData *)0x0) {
            bVar10 = testing::internal::IsTrue(true);
            if ((bVar10) && (local_390.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_390.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_4.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 100000);
      tris.nStored = 0;
      (*(tris.alloc.memoryResource)->_vptr_memory_resource[3])
                (tris.alloc.memoryResource,tris.ptr,tris.nAlloc << 3,8);
      if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (vertices.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vertices.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vertices.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vertices.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

TEST(Triangle, Watertight) {
    RNG rng(12111);
    int nTheta = 16, nPhi = 16;
    ASSERT_GE(nTheta, 3);
    ASSERT_GE(nPhi, 4);

    // Make a triangle mesh representing a triangulated sphere (with
    // vertices randomly offset along their normal), centered at the
    // origin.
    int nVertices = nTheta * nPhi;
    std::vector<Point3f> vertices;
    for (int t = 0; t < nTheta; ++t) {
        Float theta = Pi * (Float)t / (Float)(nTheta - 1);
        Float cosTheta = std::cos(theta);
        Float sinTheta = std::sin(theta);
        for (int p = 0; p < nPhi; ++p) {
            Float phi = 2 * Pi * (Float)p / (Float)(nPhi - 1);
            Float radius = 1;
            // Make sure all of the top and bottom vertices are coincident.
            if (t == 0)
                vertices.push_back(Point3f(0, 0, radius));
            else if (t == nTheta - 1)
                vertices.push_back(Point3f(0, 0, -radius));
            else if (p == nPhi - 1)
                // Close it up exactly at the end
                vertices.push_back(vertices[vertices.size() - (nPhi - 1)]);
            else {
                radius += 5 * rng.Uniform<Float>();
                vertices.push_back(Point3f(0, 0, 0) +
                                   radius * SphericalDirection(sinTheta, cosTheta, phi));
            }
        }
    }
    EXPECT_EQ(nVertices, vertices.size());

    std::vector<int> indices;
    // fan at top
    auto offset = [nPhi](int t, int p) { return t * nPhi + p; };
    for (int p = 0; p < nPhi - 1; ++p) {
        indices.push_back(offset(0, 0));
        indices.push_back(offset(1, p));
        indices.push_back(offset(1, p + 1));
    }

    // quads in the middle rows
    for (int t = 1; t < nTheta - 2; ++t) {
        for (int p = 0; p < nPhi - 1; ++p) {
            indices.push_back(offset(t, p));
            indices.push_back(offset(t + 1, p));
            indices.push_back(offset(t + 1, p + 1));

            indices.push_back(offset(t, p));
            indices.push_back(offset(t + 1, p + 1));
            indices.push_back(offset(t, p + 1));
        }
    }

    // fan at bottom
    for (int p = 0; p < nPhi - 1; ++p) {
        indices.push_back(offset(nTheta - 1, 0));
        indices.push_back(offset(nTheta - 2, p));
        indices.push_back(offset(nTheta - 2, p + 1));
    }

    Transform identity;
    TriangleMesh mesh(identity, false, indices, vertices, {}, {}, {}, {});
    pstd::vector<ShapeHandle> tris = Triangle::CreateTriangles(&mesh, Allocator());

    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        // Choose a random point in sphere of radius 0.5 around the origin.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Point3f p = Point3f(0, 0, 0) + Float(0.5) * SampleUniformSphere(u);

        // Choose a random direction.
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Ray r(p, SampleUniformSphere(u));
        int nHits = 0;
        for (const auto &tri : tris) {
            if (tri.Intersect(r))
                ++nHits;
        }
        EXPECT_GE(nHits, 1);

        // Now tougher: shoot directly at a vertex.
        Point3f pVertex = vertices[rng.Uniform<uint32_t>(vertices.size())];
        r.d = pVertex - r.o;
        nHits = 0;
        for (const auto &tri : tris) {
            if (tri.Intersect(r).has_value())
                ++nHits;
        }
        EXPECT_GE(nHits, 1) << pVertex;
    }
}